

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-million-timers.c
# Opt level: O2

int run_benchmark_million_timers(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  void *__ptr;
  uv_loop_t *loop;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  char *__format;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char *pcVar17;
  undefined8 uVar18;
  int64_t eval_b;
  int64_t eval_a;
  
  __ptr = malloc(1200000000);
  if (__ptr == (void *)0x0) {
    pcVar9 = "!=";
    pcVar17 = "!=";
    eval_b = 0;
    eval_a = 0;
    pcVar10 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar8 = "timers";
    uVar18 = 0x34;
  }
  else {
    loop = uv_default_loop();
    uVar3 = uv_hrtime();
    uVar11 = 0;
    uVar7 = 0;
    for (lVar12 = 0; auVar1._8_8_ = 0, auVar1._0_8_ = uVar11, lVar12 != 1200000000;
        lVar12 = lVar12 + 0x78) {
      iVar2 = uv_timer_init(loop,(uv_timer_t *)((long)__ptr + lVar12));
      eval_a = (int64_t)iVar2;
      eval_b = 0;
      if (eval_a != 0) {
        pcVar10 = "0";
        pcVar8 = "uv_timer_init(loop, timers + i)";
        uVar18 = 0x3c;
        goto LAB_00109c72;
      }
      uVar7 = uVar7 + (SUB164(auVar1 / ZEXT816(1000),0) * 120000 == (int)lVar12);
      iVar2 = uv_timer_start((uv_timer_t *)((long)__ptr + lVar12),timer_cb,(ulong)uVar7,0);
      eval_a = (int64_t)iVar2;
      eval_b = 0;
      if (eval_a != 0) {
        pcVar10 = "0";
        pcVar8 = "uv_timer_start(timers + i, timer_cb, timeout, 0)";
        uVar18 = 0x3d;
        goto LAB_00109c72;
      }
      uVar11 = uVar11 + 1;
    }
    uVar4 = uv_hrtime();
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    eval_a = (int64_t)iVar2;
    eval_b = 0;
    if (eval_a == 0) {
      uVar5 = uv_hrtime();
      for (lVar12 = 0; lVar12 != 1200000000; lVar12 = lVar12 + 0x78) {
        uv_close((uv_handle_t *)((long)__ptr + lVar12),close_cb);
      }
      iVar2 = uv_run(loop,UV_RUN_DEFAULT);
      eval_a = (int64_t)iVar2;
      eval_b = 0;
      if (eval_a == 0) {
        uVar6 = uv_hrtime();
        eval_a = (int64_t)timer_cb_called;
        eval_b = 10000000;
        if (eval_a == 10000000) {
          eval_a = (int64_t)close_cb_called;
          eval_b = 10000000;
          if (eval_a == 10000000) {
            free(__ptr);
            lVar12 = uVar6 - uVar3;
            auVar13._8_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar13._0_8_ = lVar12;
            auVar13._12_4_ = 0x45300000;
            fprintf(_stderr,"%.2f seconds total\n",
                    ((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / 1000000000.0)
            ;
            lVar12 = uVar4 - uVar3;
            auVar14._8_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar14._0_8_ = lVar12;
            auVar14._12_4_ = 0x45300000;
            fprintf(_stderr,"%.2f seconds init\n",
                    ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / 1000000000.0)
            ;
            lVar12 = uVar5 - uVar4;
            auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar15._0_8_ = lVar12;
            auVar15._12_4_ = 0x45300000;
            fprintf(_stderr,"%.2f seconds dispatch\n",
                    ((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / 1000000000.0)
            ;
            lVar12 = uVar6 - uVar5;
            auVar16._8_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar16._0_8_ = lVar12;
            auVar16._12_4_ = 0x45300000;
            fprintf(_stderr,"%.2f seconds cleanup\n",
                    ((auVar16._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / 1000000000.0)
            ;
            fflush(_stderr);
            uv_walk(loop,close_walk_cb,(void *)0x0);
            uv_run(loop,UV_RUN_DEFAULT);
            eval_a = 0;
            iVar2 = uv_loop_close(loop);
            eval_b = (int64_t)iVar2;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar10 = "uv_loop_close(loop)";
            pcVar8 = "0";
            uVar18 = 0x54;
          }
          else {
            pcVar10 = "(10 * 1000 * 1000)";
            pcVar8 = "close_cb_called";
            uVar18 = 0x4b;
          }
        }
        else {
          pcVar10 = "(10 * 1000 * 1000)";
          pcVar8 = "timer_cb_called";
          uVar18 = 0x4a;
        }
      }
      else {
        pcVar10 = "0";
        pcVar8 = "uv_run(loop, UV_RUN_DEFAULT)";
        uVar18 = 0x47;
      }
    }
    else {
      pcVar10 = "0";
      pcVar8 = "uv_run(loop, UV_RUN_DEFAULT)";
      uVar18 = 0x41;
    }
LAB_00109c72:
    pcVar9 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar17 = "==";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/benchmark-million-timers.c"
          ,uVar18,pcVar8,pcVar9,pcVar10,eval_a,pcVar17,eval_b);
  abort();
}

Assistant:

BENCHMARK_IMPL(million_timers) {
  uv_timer_t* timers;
  uv_loop_t* loop;
  uint64_t before_all;
  uint64_t before_run;
  uint64_t after_run;
  uint64_t after_all;
  int timeout;
  int i;

  timers = malloc(NUM_TIMERS * sizeof(timers[0]));
  ASSERT_NOT_NULL(timers);

  loop = uv_default_loop();
  timeout = 0;

  before_all = uv_hrtime();
  for (i = 0; i < NUM_TIMERS; i++) {
    if (i % 1000 == 0) timeout++;
    ASSERT_OK(uv_timer_init(loop, timers + i));
    ASSERT_OK(uv_timer_start(timers + i, timer_cb, timeout, 0));
  }

  before_run = uv_hrtime();
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  after_run = uv_hrtime();

  for (i = 0; i < NUM_TIMERS; i++)
    uv_close((uv_handle_t*) (timers + i), close_cb);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  after_all = uv_hrtime();

  ASSERT_EQ(timer_cb_called, NUM_TIMERS);
  ASSERT_EQ(close_cb_called, NUM_TIMERS);
  free(timers);

  fprintf(stderr, "%.2f seconds total\n", (after_all - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds init\n", (before_run - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds dispatch\n", (after_run - before_run) / 1e9);
  fprintf(stderr, "%.2f seconds cleanup\n", (after_all - after_run) / 1e9);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}